

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyjson.h
# Opt level: O2

bool tinyjson::json_parser::parse_array(json_node *value,char **token,string *err)

{
  char cVar1;
  char *pcVar2;
  Storage SVar3;
  bool bVar4;
  int iVar5;
  vector<tinyjson::json_node*,std::allocator<tinyjson::json_node*>> *this;
  size_t sVar6;
  json_node *value_00;
  string *this_00;
  char *pcVar7;
  json_node *current_value;
  double value_1;
  undefined5 uStack_70;
  undefined1 uStack_6b;
  undefined2 uStack_6a;
  undefined1 uStack_68;
  undefined5 uStack_67;
  
  this = (vector<tinyjson::json_node*,std::allocator<tinyjson::json_node*>> *)operator_new(0x18);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  pcVar2 = *token;
  sVar6 = strspn(pcVar2," \t\n\r");
  pcVar7 = pcVar2 + sVar6;
  *token = pcVar7;
  if (pcVar2[sVar6] == ']') {
    *token = pcVar7 + 1;
    value->type = array_type;
    (value->storage).array_val = (array *)this;
    return true;
  }
  do {
    value_00 = (json_node *)operator_new(0x10);
    (value_00->storage).num_val = 0.0;
    value_00->type = null_type;
    current_value = value_00;
    sVar6 = strspn(pcVar7," \t\n\r");
    pcVar2 = pcVar7 + sVar6;
    *token = pcVar2;
    if (pcVar7[sVar6] == '{') {
      *token = pcVar2 + 1;
      bVar4 = parse_object(value_00,token,err);
LAB_0010317a:
      if (bVar4 == false) {
        return false;
      }
    }
    else {
      sVar6 = strspn(pcVar2," \t\n\r");
      pcVar7 = pcVar2 + sVar6;
      *token = pcVar7;
      cVar1 = pcVar2[sVar6];
      if (cVar1 != '\"') {
        if (cVar1 == 't') {
          iVar5 = strncmp(pcVar7,"true",4);
          if (iVar5 == 0) {
            value_00->type = boolean_type;
            (value_00->storage).bool_val = true;
LAB_0010320c:
            pcVar7 = pcVar7 + 4;
LAB_00103335:
            *token = pcVar7;
            goto LAB_00103338;
          }
        }
        else if (cVar1 == 'f') {
          iVar5 = strncmp(pcVar7,"false",5);
          if (iVar5 == 0) {
            value_00->type = boolean_type;
            (value_00->storage).bool_val = false;
            pcVar7 = pcVar7 + 5;
            goto LAB_00103335;
          }
        }
        else if (cVar1 == 'n') {
          iVar5 = strncmp(pcVar7,"null",4);
          if (iVar5 == 0) goto LAB_0010320c;
        }
        else if (cVar1 == '[') {
          *token = pcVar7 + 1;
          bVar4 = parse_array(value_00,token,err);
          goto LAB_0010317a;
        }
        sVar6 = strspn(pcVar7," \t");
        pcVar7 = pcVar7 + sVar6;
        *token = pcVar7;
        sVar6 = strcspn(pcVar7," \t,\n\r}]");
        if (sVar6 != 0) {
          bVar4 = atod(pcVar7,pcVar7 + sVar6,&value_1);
          if (bVar4) {
            SVar3._5_3_ = value_1._5_3_;
            SVar3._0_5_ = value_1._0_5_;
            *token = pcVar7 + sVar6;
            value_00->type = number_type;
            value_00->storage = SVar3;
            goto LAB_00103338;
          }
        }
        uStack_70 = 0x2e726f72;
        value_1._0_5_ = 0x6573726170;
        value_1._5_3_ = 0x726520;
        goto LAB_001033e2;
      }
      value_1._0_5_ = SUB85(&uStack_68,0);
      value_1._5_3_ = (undefined3)((ulong)&uStack_68 >> 0x28);
      uStack_70 = 0;
      uStack_6b = 0;
      uStack_6a = 0;
      uStack_68 = 0;
      if (*pcVar7 == '\"') {
        pcVar7 = pcVar7 + 1;
        *token = pcVar7;
      }
      sVar6 = strcspn(pcVar7,"\"");
      uStack_70 = 0;
      uStack_6b = 0;
      uStack_6a = 0;
      uStack_68 = 0;
      if (sVar6 != 0) {
        std::__cxx11::string::assign((char *)&value_1,(ulong)pcVar7);
      }
      *token = pcVar7 + sVar6 + 1;
      value_00->type = string_type;
      this_00 = (string *)operator_new(0x20);
      std::__cxx11::string::string((string *)this_00,(string *)&value_1);
      (value_00->storage).str_val = this_00;
      std::__cxx11::string::~string((string *)&value_1);
    }
LAB_00103338:
    std::vector<tinyjson::json_node*,std::allocator<tinyjson::json_node*>>::
    emplace_back<tinyjson::json_node*&>(this,&current_value);
    pcVar2 = *token;
    sVar6 = strspn(pcVar2," \t\n\r");
    pcVar7 = pcVar2 + sVar6;
    *token = pcVar7;
    if (pcVar2[sVar6] != ',') {
      sVar6 = strspn(pcVar7," \t\n\r");
      *token = pcVar7 + sVar6;
      if (pcVar7[sVar6] == ']') {
        *token = pcVar7 + sVar6 + 1;
        value->type = array_type;
        (value->storage).array_val = (array *)this;
        return true;
      }
      value_1._0_5_ = 0x6c61766e69;
      value_1._5_3_ = 0x206469;
      uStack_70 = 0x6f20646e65;
      uStack_6b = 0x66;
      uStack_6a = 0x6120;
      uStack_68 = 0x72;
      uStack_67 = 0x2e796172;
LAB_001033e2:
      std::__cxx11::string::assign((char *)err);
      return false;
    }
    pcVar7 = pcVar7 + 1;
    *token = pcVar7;
  } while( true );
}

Assistant:

static bool parse_array(json_node& value, const char** token, std::string& err) {
      array* root = new array();

      // empty array
      if (expect_token(token, token_type::end_array)) {
        value.set(root);
        return true;
      }

      do {
        json_node* current_value = new json_node();
        if (expect_token(token, token_type::start_object)) {
          if (!parse_object(*current_value, token, err)) return false;
        } else if (expect_token(token, token_type::start_array)) {
          if (!parse_array(*current_value, token, err)) return false;
        } else {
          if (!parse_value(*current_value, token, err)) return false;
        }
        root->emplace_back(current_value);
      } while(expect_token(token, token_type::comma));

      if (!expect_token(token, token_type::end_array)) {
        return make_err_msg("invalid end of array.", err);
      }

      value.set(root);
      return true;
    }